

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O3

void __thiscall
despot::MemoryPool<despot::POMDPXState>::DeleteAll(MemoryPool<despot::POMDPXState> *this)

{
  Chunk *pCVar1;
  pointer ppCVar2;
  pointer ppPVar3;
  long lVar4;
  pointer ppCVar5;
  
  ppCVar5 = (this->chunks_).
            super__Vector_base<despot::MemoryPool<despot::POMDPXState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::POMDPXState>::Chunk_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar5 !=
      (this->chunks_).
      super__Vector_base<despot::MemoryPool<despot::POMDPXState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::POMDPXState>::Chunk_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pCVar1 = *ppCVar5;
      if (pCVar1 != (Chunk *)0x0) {
        lVar4 = 0x37c8;
        do {
          POMDPXState::~POMDPXState
                    ((POMDPXState *)((long)&pCVar1->Objects[0].super_State._vptr_State + lVar4));
          lVar4 = lVar4 + -0x38;
        } while (lVar4 != -0x38);
      }
      operator_delete(pCVar1,0x3800);
      ppCVar5 = ppCVar5 + 1;
    } while (ppCVar5 !=
             (this->chunks_).
             super__Vector_base<despot::MemoryPool<despot::POMDPXState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::POMDPXState>::Chunk_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    ppCVar2 = (this->chunks_).
              super__Vector_base<despot::MemoryPool<despot::POMDPXState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::POMDPXState>::Chunk_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppCVar5 != ppCVar2) {
      (this->chunks_).
      super__Vector_base<despot::MemoryPool<despot::POMDPXState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::POMDPXState>::Chunk_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppCVar2;
    }
  }
  ppPVar3 = (this->freelist_).
            super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->freelist_).
      super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppPVar3) {
    (this->freelist_).
    super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppPVar3;
  }
  this->num_allocated_ = 0;
  return;
}

Assistant:

void DeleteAll() {
		for (chunk_iterator_ i_chunk = chunks_.begin();
			i_chunk != chunks_.end(); ++i_chunk)
			delete *i_chunk;
		chunks_.clear();
		freelist_.clear();
		num_allocated_ = 0;
	}